

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v8::detail::count_digits_fallback<unsigned__int128>(detail *this,unsigned___int128 n)

{
  undefined8 in_RSI;
  undefined1 auVar1 [16];
  int local_3c;
  ulong uStack_38;
  int count;
  unsigned___int128 n_local;
  
  auVar1._8_8_ = in_RSI;
  auVar1._0_8_ = this;
  local_3c = 1;
  while( true ) {
    n_local._0_8_ = auVar1._8_8_;
    uStack_38 = auVar1._0_8_;
    if ((long)n_local == 0 && (ulong)(9 < uStack_38) <= (ulong)-(long)n_local) {
      return local_3c;
    }
    if ((long)n_local == 0 && (ulong)(99 < uStack_38) <= (ulong)-(long)n_local) {
      return local_3c + 1;
    }
    if ((long)n_local == 0 && (ulong)(999 < uStack_38) <= (ulong)-(long)n_local) {
      return local_3c + 2;
    }
    if ((long)n_local == 0 && (ulong)(9999 < uStack_38) <= (ulong)-(long)n_local) break;
    auVar1 = __udivti3(uStack_38,(long)n_local,10000,0);
    local_3c = local_3c + 4;
  }
  return local_3c + 3;
}

Assistant:

FMT_CONSTEXPR auto count_digits_fallback(T n) -> int {
  int count = 1;
  for (;;) {
    // Integer division is slow so do it for a group of four digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    if (n < 10) return count;
    if (n < 100) return count + 1;
    if (n < 1000) return count + 2;
    if (n < 10000) return count + 3;
    n /= 10000u;
    count += 4;
  }
}